

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

BIO * BIO_find_type(BIO *b,int bio_type)

{
  uint uVar1;
  int mask;
  int method_type;
  int type_local;
  BIO *bio_local;
  
  if (b != (BIO *)0x0) {
    _method_type = b;
    do {
      if (_method_type->method != (BIO_METHOD *)0x0) {
        uVar1 = _method_type->method->type;
        if ((bio_type & 0xffU) == 0) {
          if ((uVar1 & bio_type) != 0) {
            return _method_type;
          }
        }
        else if (uVar1 == bio_type) {
          return _method_type;
        }
      }
      _method_type = (BIO *)_method_type->ptr;
    } while (_method_type != (BIO *)0x0);
  }
  return (BIO *)0x0;
}

Assistant:

BIO *BIO_find_type(BIO *bio, int type) {
  int method_type, mask;

  if (!bio) {
    return NULL;
  }
  mask = type & 0xff;

  do {
    if (bio->method != NULL) {
      method_type = bio->method->type;

      if (!mask) {
        if (method_type & type) {
          return bio;
        }
      } else if (method_type == type) {
        return bio;
      }
    }
    bio = bio->next_bio;
  } while (bio != NULL);

  return NULL;
}